

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O0

Maybe<capnp::schema::Node::Reader> * __thiscall
capnp::compiler::Compiler::Node::getFinalSchema
          (Maybe<capnp::schema::Node::Reader> *__return_storage_ptr__,Node *this)

{
  Content *content;
  CompiledModule *local_30;
  Content *_content640;
  Reader *schema;
  Reader *_schema638;
  Node *this_local;
  
  _schema638 = (Reader *)this;
  this_local = (Node *)__return_storage_ptr__;
  _content640 = (Content *)kj::_::readMaybe<capnp::schema::Node::Reader>(&this->loadedFinalSchema);
  schema = (Reader *)_content640;
  if (_content640 == (Content *)0x0) {
    getContent((Node *)&content,(State)this);
    local_30 = (CompiledModule *)
               kj::_::readMaybe<capnp::compiler::Compiler::Node::Content>
                         ((Maybe<capnp::compiler::Compiler::Node::Content_&> *)&content);
    if (local_30 == (CompiledModule *)0x0) {
      kj::Maybe<capnp::schema::Node::Reader>::Maybe(__return_storage_ptr__);
    }
    else {
      kj::Maybe<capnp::schema::Node::Reader>::Maybe
                (__return_storage_ptr__,
                 (Maybe<capnp::schema::Node::Reader> *)
                 ((local_30->contentArena).super_MessageBuilder.arenaSpace + 0x11));
    }
  }
  else {
    kj::Maybe<capnp::schema::Node::Reader>::Maybe(__return_storage_ptr__,(Reader *)_content640);
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<schema::Node::Reader> Compiler::Node::getFinalSchema() {
  KJ_IF_SOME(schema, loadedFinalSchema) {
    return schema;
  } else KJ_IF_SOME(content, getContent(Content::FINISHED)) {
    return content.finalSchema;
  } else {
    return kj::none;
  }
}